

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_b3fcdf::X509Test_SignatureVerification_Test::TestBody
          (X509Test_SignatureVerification_Test *this)

{
  X509 *pXVar1;
  _Head_base<0UL,_x509_st_*,_false> _Var2;
  unique_ptr<x509_st,_bssl::internal::Deleter> leaf_00;
  int iVar3;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  bool bVar5;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  initializer_list<x509_st_*> __l_07;
  initializer_list<x509_st_*> __l_08;
  initializer_list<x509_st_*> __l_09;
  initializer_list<x509_st_*> __l_10;
  initializer_list<x509_st_*> __l_11;
  initializer_list<x509_st_*> __l_12;
  initializer_list<x509_st_*> __l_13;
  initializer_list<x509_st_*> __l_14;
  initializer_list<x509_st_*> __l_15;
  initializer_list<x509_st_*> __l_16;
  initializer_list<x509_st_*> __l_17;
  initializer_list<x509_st_*> __l_18;
  initializer_list<x509_st_*> __l_19;
  initializer_list<x509_st_*> __l_20;
  initializer_list<x509_st_*> __l_21;
  initializer_list<x509_st_*> __l_22;
  initializer_list<x509_st_*> __l_23;
  initializer_list<x509_st_*> __l_24;
  initializer_list<x509_st_*> __l_25;
  initializer_list<x509_st_*> __l_26;
  initializer_list<x509_st_*> __l_27;
  initializer_list<x509_st_*> __l_28;
  initializer_list<x509_st_*> __l_29;
  initializer_list<x509_st_*> __l_30;
  initializer_list<x509_st_*> __l_31;
  initializer_list<x509_st_*> __l_32;
  initializer_list<x509_st_*> __l_33;
  initializer_list<x509_st_*> __l_34;
  initializer_list<x509_st_*> __l_35;
  initializer_list<x509_st_*> __l_36;
  Certs leaf;
  Certs intermediate;
  Certs root;
  anon_class_8_1_ba1d59bf make_certs;
  UniquePtr<EVP_PKEY> key;
  allocator_type local_432;
  allocator_type local_431;
  AssertHelper local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_428;
  int local_41c;
  undefined1 local_418 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_410;
  pointer local_408;
  undefined1 local_3f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  int local_3cc;
  _Head_base<0UL,_x509_st_*,_false> local_3c8;
  _Head_base<0UL,_x509_st_*,_false> local_3c0;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_3b8;
  undefined1 local_3a0 [8];
  _Head_base<0UL,_x509_st_*,_false> local_398;
  undefined1 local_390 [16];
  _Head_base<0UL,_x509_st_*,_false> local_380;
  undefined1 local_378 [8];
  __uniq_ptr_impl<x509_st,_bssl::internal::Deleter> local_370;
  undefined1 local_368 [16];
  _Head_base<0UL,_x509_st_*,_false> local_358;
  undefined1 local_350 [24];
  unique_ptr<x509_st,_bssl::internal::Deleter> local_338;
  _Head_base<0UL,_x509_st_*,_false> local_330;
  anon_class_8_1_ba1d59bf local_328;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_320;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  _Any_data local_2f8;
  code *local_2e8;
  undefined8 uStack_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  undefined8 uStack_2c0;
  _Any_data local_2b8;
  code *local_2a8;
  undefined8 uStack_2a0;
  _Any_data local_298;
  code *local_288;
  undefined8 uStack_280;
  _Any_data local_278;
  code *local_268;
  undefined8 uStack_260;
  _Any_data local_258;
  code *local_248;
  undefined8 uStack_240;
  _Any_data local_238;
  code *local_228;
  undefined8 uStack_220;
  _Any_data local_218;
  code *local_208;
  undefined8 uStack_200;
  _Any_data local_1f8;
  code *local_1e8;
  undefined8 uStack_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  undefined8 uStack_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  undefined8 uStack_1a0;
  _Any_data local_198;
  code *local_188;
  undefined8 uStack_180;
  _Any_data local_178;
  code *local_168;
  undefined8 uStack_160;
  _Any_data local_158;
  code *local_148;
  undefined8 uStack_140;
  _Any_data local_138;
  code *local_128;
  undefined8 uStack_120;
  _Any_data local_118;
  code *local_108;
  undefined8 uStack_100;
  _Any_data local_f8;
  code *local_e8;
  undefined8 uStack_e0;
  _Any_data local_d8;
  code *local_c8;
  undefined8 uStack_c0;
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  PrivateKeyFromPEM((anon_unknown_dwarf_b3fcdf *)&local_320,
                    "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                   );
  local_378[0] = (internal)
                 ((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
                  local_320._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
                 (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0);
  local_370._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
       (tuple<x509_st_*,_bssl::internal::Deleter>)
       (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)0x0;
  if ((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
      local_320._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) {
    testing::Message::Message((Message *)local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_350,(internal *)local_378,(AssertionResult *)0x5e57b2,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x117c,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
    if (local_350._0_8_ != (long)local_350 + 0x10) {
      operator_delete((void *)local_350._0_8_,(ulong)(local_350._16_8_ + 1));
    }
    if ((long *)CONCAT71(local_3a0._1_7_,local_3a0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_3a0._1_7_,local_3a0[0]) + 8))();
    }
    if ((_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
        local_370._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl != (x509_st *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_370,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_370._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
    }
    goto LAB_003c8fe9;
  }
  local_328.key = (UniquePtr<EVP_PKEY> *)&local_320;
  TestBody::anon_class_8_1_ba1d59bf::operator()((Certs *)local_350,&local_328,"Root","Root",true);
  local_3a0[0] = (internal)((x509_st *)local_350._0_8_ != (x509_st *)0x0);
  local_398._M_head_impl = (x509_st *)0x0;
  if ((x509_st *)local_350._0_8_ == (x509_st *)0x0) {
    testing::Message::Message((Message *)local_3f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_378,(internal *)local_3a0,(AssertionResult *)"root.valid","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_418,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x11c7,(char *)CONCAT71(local_378._1_7_,local_378[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
    if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != local_368) {
      operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]),
                      (ulong)(local_368._0_8_ + 1));
    }
    if (local_3f8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_3f8 + 8))();
    }
    if ((_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)local_398._M_head_impl !=
        (x509_st *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_398,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_398._M_head_impl);
    }
  }
  else {
    TestBody::anon_class_8_1_ba1d59bf::operator()
              ((Certs *)local_378,&local_328,"Root","Intermediate",true);
    bVar5 = CONCAT71(local_378._1_7_,local_378[0]) == 0;
    local_3f8[0] = !bVar5;
    pbStack_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar5) {
      testing::Message::Message((Message *)local_418);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_3a0,(internal *)local_3f8,(AssertionResult *)"intermediate.valid",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x11c9,(char *)CONCAT71(local_3a0._1_7_,local_3a0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_418);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
      if ((undefined1 *)CONCAT71(local_3a0._1_7_,local_3a0[0]) != local_390) {
        operator_delete((undefined1 *)CONCAT71(local_3a0._1_7_,local_3a0[0]),
                        (ulong)(local_390._0_8_ + 1));
      }
      if (local_418 != (undefined1  [8])0x0) {
        (*(code *)(*(x509_st **)local_418)->sig_alg)();
      }
      if (pbStack_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_3f0,pbStack_3f0);
      }
    }
    else {
      TestBody::anon_class_8_1_ba1d59bf::operator()
                ((Certs *)local_3a0,&local_328,"Intermediate","Leaf",false);
      pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
      local_418[0] = pXVar1 != (X509 *)0x0;
      pbStack_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (pXVar1 == (X509 *)0x0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pbStack_410;
        testing::Message::Message((Message *)&local_3b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_3f8,(internal *)local_418,(AssertionResult *)"leaf.valid","false"
                   ,"true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_430,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x11cb,(char *)local_3f8);
        testing::internal::AssertHelper::operator=(&local_430,(Message *)&local_3b8);
        testing::internal::AssertHelper::~AssertHelper(&local_430);
        if (local_3f8 != (undefined1  [8])&local_3e8) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
        }
        if (local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          (*(code *)(*local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
        }
        local_428 = pbStack_410;
        if (pbStack_410 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_003c8f21;
      }
      else {
        local_41c = 0;
        local_3c0._M_head_impl = (x509_st *)local_350._0_8_;
        __l._M_len = 1;
        __l._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l,&local_431);
        local_3c8._M_head_impl = (x509_st *)CONCAT71(local_378._1_7_,local_378[0]);
        __l_00._M_len = 1;
        __l_00._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_00,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_38._M_unused._M_object = (void *)0x0;
        local_38._8_8_ = 0;
        local_28 = (code *)0x0;
        uStack_20 = 0;
        local_3cc = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_38);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"0",
                   "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.valid.get()}, {})",
                   &local_41c,&local_3cc);
        if (local_28 != (code *)0x0) {
          (*local_28)(&local_38,&local_38,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x11cf,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_41c = 7;
        local_3c0._M_head_impl = (x509_st *)local_350._0_8_;
        __l_01._M_len = 1;
        __l_01._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_01,&local_431);
        local_3c8._M_head_impl = (x509_st *)CONCAT71(local_378._1_7_,local_378[0]);
        __l_02._M_len = 1;
        __l_02._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_02,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_58._M_unused._M_object = (void *)0x0;
        local_58._8_8_ = 0;
        local_48 = (code *)0x0;
        uStack_40 = 0;
        local_3cc = Verify(local_380._M_head_impl,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_58);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"7",
                   "Verify(leaf.bad_sig.get(), {root.valid.get()}, {intermediate.valid.get()}, {})",
                   &local_41c,&local_3cc);
        if (local_48 != (code *)0x0) {
          (*local_48)(&local_58,&local_58,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x11d4,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_41c = 7;
        local_3c0._M_head_impl = (x509_st *)local_350._0_8_;
        __l_03._M_len = 1;
        __l_03._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_03,&local_431);
        local_3c8._M_head_impl = (x509_st *)CONCAT71(local_378._1_7_,local_378[0]);
        __l_04._M_len = 1;
        __l_04._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_04,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_78._M_unused._M_object = (void *)0x0;
        local_78._8_8_ = 0;
        local_68 = (code *)0x0;
        uStack_60 = 0;
        local_3cc = Verify((X509 *)local_390._8_8_,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_78);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"7",
                   "Verify(leaf.bad_sig_type.get(), {root.valid.get()}, {intermediate.valid.get()}, {})"
                   ,&local_41c,&local_3cc);
        if (local_68 != (code *)0x0) {
          (*local_68)(&local_78,&local_78,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if (local_3f8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x11d7,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_3f8 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_41c = 7;
        pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
        local_3c0._M_head_impl = (x509_st *)local_350._0_8_;
        __l_05._M_len = 1;
        __l_05._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_05,&local_431);
        local_3c8._M_head_impl = local_358._M_head_impl;
        __l_06._M_len = 1;
        __l_06._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_06,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_98._M_unused._M_object = (void *)0x0;
        local_98._8_8_ = 0;
        local_88 = (code *)0x0;
        uStack_80 = 0;
        local_3cc = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_98);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"7",
                   "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.bad_sig.get()}, {})",
                   &local_41c,&local_3cc);
        if (local_88 != (code *)0x0) {
          (*local_88)(&local_98,&local_98,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if (local_3f8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x11da,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )local_3f8 !=
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_41c = 7;
        pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
        local_3c0._M_head_impl = (x509_st *)local_350._0_8_;
        __l_07._M_len = 1;
        __l_07._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_07,&local_431);
        local_3c8._M_head_impl = (x509_st *)local_368._8_8_;
        __l_08._M_len = 1;
        __l_08._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_08,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b8._M_unused._M_object = (void *)0x0;
        local_b8._8_8_ = 0;
        local_a8 = (code *)0x0;
        uStack_a0 = 0;
        local_3cc = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_b8);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"7",
                   "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.bad_sig_type.get()}, {})"
                   ,&local_41c,&local_3cc);
        if (local_a8 != (code *)0x0) {
          (*local_a8)(&local_b8,&local_b8,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x11dd,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_41c = 0;
        pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
        local_3c0._M_head_impl = local_330._M_head_impl;
        __l_09._M_len = 1;
        __l_09._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_09,&local_431);
        local_3c8._M_head_impl = (x509_st *)CONCAT71(local_378._1_7_,local_378[0]);
        __l_10._M_len = 1;
        __l_10._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_10,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d8._M_unused._M_object = (void *)0x0;
        local_d8._8_8_ = 0;
        local_c8 = (code *)0x0;
        uStack_c0 = 0;
        local_3cc = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_d8);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"0",
                   "Verify(leaf.valid.get(), {root.bad_sig.get()}, {intermediate.valid.get()}, {})",
                   &local_41c,&local_3cc);
        if (local_c8 != (code *)0x0) {
          (*local_c8)(&local_d8,&local_d8,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x11e1,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_41c = 0;
        pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
        local_3c0._M_head_impl =
             (x509_st *)
             local_338._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        __l_11._M_len = 1;
        __l_11._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_11,&local_431);
        local_3c8._M_head_impl = (x509_st *)CONCAT71(local_378._1_7_,local_378[0]);
        __l_12._M_len = 1;
        __l_12._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_12,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_f8._M_unused._M_object = (void *)0x0;
        local_f8._8_8_ = 0;
        local_e8 = (code *)0x0;
        uStack_e0 = 0;
        local_3cc = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_f8);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"0",
                   "Verify(leaf.valid.get(), {root.bad_sig_type.get()}, {intermediate.valid.get()}, {})"
                   ,&local_41c,&local_3cc);
        if (local_e8 != (code *)0x0) {
          (*local_e8)(&local_f8,&local_f8,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if (local_3f8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x11e3,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_3f8 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_41c = 7;
        pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
        local_3c0._M_head_impl = local_330._M_head_impl;
        __l_13._M_len = 1;
        __l_13._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_13,&local_431);
        local_3c8._M_head_impl = (x509_st *)CONCAT71(local_378._1_7_,local_378[0]);
        __l_14._M_len = 1;
        __l_14._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_14,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_118._M_unused._M_object = (void *)0x0;
        local_118._8_8_ = 0;
        local_108 = (code *)0x0;
        uStack_100 = 0;
        local_3cc = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,
                           0x4000,(function<void_(x509_store_ctx_st_*)> *)&local_118);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"7",
                   "Verify(leaf.valid.get(), {root.bad_sig.get()}, {intermediate.valid.get()}, {}, 0x4000)"
                   ,&local_41c,&local_3cc);
        if (local_108 != (code *)0x0) {
          (*local_108)(&local_118,&local_118,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if (local_3f8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x11e9,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )local_3f8 !=
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_41c = 7;
        pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
        local_3c0._M_head_impl =
             (x509_st *)
             local_338._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        __l_15._M_len = 1;
        __l_15._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_15,&local_431);
        local_3c8._M_head_impl = (x509_st *)CONCAT71(local_378._1_7_,local_378[0]);
        __l_16._M_len = 1;
        __l_16._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_16,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_138._M_unused._M_object = (void *)0x0;
        local_138._8_8_ = 0;
        local_128 = (code *)0x0;
        uStack_120 = 0;
        local_3cc = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,
                           0x4000,(function<void_(x509_store_ctx_st_*)> *)&local_138);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"7",
                   "Verify(leaf.valid.get(), {root.bad_sig_type.get()}, {intermediate.valid.get()}, {}, 0x4000)"
                   ,&local_41c,&local_3cc);
        if (local_128 != (code *)0x0) {
          (*local_128)(&local_138,&local_138,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x11ed,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        _Var2._M_head_impl = local_330._M_head_impl;
        local_3c8._M_head_impl = local_3c8._M_head_impl & 0xffffffff00000000;
        local_3c0._M_head_impl = local_330._M_head_impl;
        __l_17._M_len = 1;
        __l_17._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_17,
                   (allocator_type *)&local_3cc);
        local_418 = (undefined1  [8])0x0;
        pbStack_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408 = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_158._M_unused._M_object = (void *)0x0;
        local_158._8_8_ = 0;
        local_148 = (code *)0x0;
        uStack_140 = 0;
        local_41c = Verify(_Var2._M_head_impl,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_158);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"0",
                   "Verify(root.bad_sig.get(), {root.bad_sig.get()}, {}, {})",(int *)&local_3c8,
                   &local_41c);
        if (local_148 != (code *)0x0) {
          (*local_148)(&local_158,&local_158,__destroy_functor);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x11f2,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        leaf_00._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)local_338;
        local_3c8._M_head_impl = local_3c8._M_head_impl & 0xffffffff00000000;
        local_3c0._M_head_impl =
             (x509_st *)
             local_338._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        __l_18._M_len = 1;
        __l_18._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_18,
                   (allocator_type *)&local_3cc);
        local_418 = (undefined1  [8])0x0;
        pbStack_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408 = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_178._M_unused._M_object = (void *)0x0;
        local_178._8_8_ = 0;
        local_168 = (code *)0x0;
        uStack_160 = 0;
        local_41c = Verify((X509 *)leaf_00._M_t.
                                   super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_178);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"0",
                   "Verify(root.bad_sig_type.get(), {root.bad_sig_type.get()}, {}, {})",
                   (int *)&local_3c8,&local_41c);
        if (local_168 != (code *)0x0) {
          (*local_168)(&local_178,&local_178,__destroy_functor);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x11f4,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_3c8._M_head_impl._0_4_ = 7;
        local_3c0._M_head_impl = local_330._M_head_impl;
        __l_19._M_len = 1;
        __l_19._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_19,
                   (allocator_type *)&local_3cc);
        local_418 = (undefined1  [8])0x0;
        pbStack_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408 = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_198._M_unused._M_object = (void *)0x0;
        local_198._8_8_ = 0;
        local_188 = (code *)0x0;
        uStack_180 = 0;
        local_41c = Verify(local_330._M_head_impl,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,
                           0x4000,(function<void_(x509_store_ctx_st_*)> *)&local_198);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"7",
                   "Verify(root.bad_sig.get(), {root.bad_sig.get()}, {}, {}, 0x4000)",
                   (int *)&local_3c8,&local_41c);
        if (local_188 != (code *)0x0) {
          (*local_188)(&local_198,&local_198,__destroy_functor);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x11f7,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_3c8._M_head_impl._0_4_ = 7;
        local_3c0._M_head_impl =
             (x509_st *)
             local_338._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        __l_20._M_len = 1;
        __l_20._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_20,
                   (allocator_type *)&local_3cc);
        local_418 = (undefined1  [8])0x0;
        pbStack_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408 = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1b8._M_unused._M_object = (void *)0x0;
        local_1b8._8_8_ = 0;
        local_1a8 = (code *)0x0;
        uStack_1a0 = 0;
        local_41c = Verify((X509 *)local_338._M_t.
                                   super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,
                           0x4000,(function<void_(x509_store_ctx_st_*)> *)&local_1b8);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"7",
                   "Verify(root.bad_sig_type.get(), {root.bad_sig_type.get()}, {}, {}, 0x4000)",
                   (int *)&local_3c8,&local_41c);
        if (local_1a8 != (code *)0x0) {
          (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x11fa,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_3c8._M_head_impl = local_3c8._M_head_impl & 0xffffffff00000000;
        pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
        local_3c0._M_head_impl = local_358._M_head_impl;
        __l_21._M_len = 1;
        __l_21._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_21,
                   (allocator_type *)&local_3cc);
        local_418 = (undefined1  [8])0x0;
        pbStack_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408 = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1d8._M_unused._M_object = (void *)0x0;
        local_1d8._8_8_ = 0;
        local_1c8 = (code *)0x0;
        uStack_1c0 = 0;
        local_41c = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,
                           0x84000,(function<void_(x509_store_ctx_st_*)> *)&local_1d8);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"0",
                   "Verify(leaf.valid.get(), {intermediate.bad_sig.get()}, {}, {}, 0x4000 | 0x80000)"
                   ,(int *)&local_3c8,&local_41c);
        if (local_1c8 != (code *)0x0) {
          (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1201,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_3c8._M_head_impl = local_3c8._M_head_impl & 0xffffffff00000000;
        pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
        local_3c0._M_head_impl = (x509_st *)local_368._8_8_;
        __l_22._M_len = 1;
        __l_22._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_22,
                   (allocator_type *)&local_3cc);
        local_418 = (undefined1  [8])0x0;
        pbStack_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408 = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1f8._M_unused._M_object = (void *)0x0;
        local_1f8._8_8_ = 0;
        local_1e8 = (code *)0x0;
        uStack_1e0 = 0;
        local_41c = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,
                           0x84000,(function<void_(x509_store_ctx_st_*)> *)&local_1f8);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"0",
                   "Verify(leaf.valid.get(), {intermediate.bad_sig_type.get()}, {}, {}, 0x4000 | 0x80000)"
                   ,(int *)&local_3c8,&local_41c);
        if (local_1e8 != (code *)0x0) {
          (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1204,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_3c8._M_head_impl = local_3c8._M_head_impl & 0xffffffff00000000;
        pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
        local_3c0._M_head_impl = local_358._M_head_impl;
        __l_23._M_len = 1;
        __l_23._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_23,
                   (allocator_type *)&local_3cc);
        local_418 = (undefined1  [8])0x0;
        pbStack_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408 = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_218._M_unused._M_object = (void *)0x0;
        local_218._8_8_ = 0;
        local_208 = (code *)0x0;
        uStack_200 = 0;
        local_41c = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,
                           0x80000,(function<void_(x509_store_ctx_st_*)> *)&local_218);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"0",
                   "Verify(leaf.valid.get(), {intermediate.bad_sig.get()}, {}, {}, 0x80000)",
                   (int *)&local_3c8,&local_41c);
        if (local_208 != (code *)0x0) {
          (*local_208)(&local_218,&local_218,__destroy_functor);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1206,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_3c8._M_head_impl = local_3c8._M_head_impl & 0xffffffff00000000;
        pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
        local_3c0._M_head_impl = (x509_st *)local_368._8_8_;
        __l_24._M_len = 1;
        __l_24._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_24,
                   (allocator_type *)&local_3cc);
        local_418 = (undefined1  [8])0x0;
        pbStack_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408 = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_238._M_unused._M_object = (void *)0x0;
        local_238._8_8_ = 0;
        local_228 = (code *)0x0;
        uStack_220 = 0;
        local_41c = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,
                           0x80000,(function<void_(x509_store_ctx_st_*)> *)&local_238);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"0",
                   "Verify(leaf.valid.get(), {intermediate.bad_sig_type.get()}, {}, {}, 0x80000)",
                   (int *)&local_3c8,&local_41c);
        if (local_228 != (code *)0x0) {
          (*local_228)(&local_238,&local_238,__destroy_functor);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1209,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_41c = 6;
        pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
        local_3c0._M_head_impl = (x509_st *)local_350._16_8_;
        __l_25._M_len = 1;
        __l_25._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_25,&local_431);
        local_3c8._M_head_impl = (x509_st *)CONCAT71(local_378._1_7_,local_378[0]);
        __l_26._M_len = 1;
        __l_26._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_26,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_258._M_unused._M_object = (void *)0x0;
        local_258._8_8_ = 0;
        local_248 = (code *)0x0;
        uStack_240 = 0;
        local_3cc = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_258);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"6",
                   "Verify(leaf.valid.get(), {root.bad_key.get()}, {intermediate.valid.get()}, {})",
                   &local_41c,&local_3cc);
        if (local_248 != (code *)0x0) {
          (*local_248)(&local_258,&local_258,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x120e,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_41c = 6;
        pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
        local_3c0._M_head_impl = (x509_st *)local_350._8_8_;
        __l_27._M_len = 1;
        __l_27._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_27,&local_431);
        local_3c8._M_head_impl = (x509_st *)CONCAT71(local_378._1_7_,local_378[0]);
        __l_28._M_len = 1;
        __l_28._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_28,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_278._M_unused._M_object = (void *)0x0;
        local_278._8_8_ = 0;
        local_268 = (code *)0x0;
        uStack_260 = 0;
        local_3cc = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_278);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"6",
                   "Verify(leaf.valid.get(), {root.bad_key_type.get()}, {intermediate.valid.get()}, {})"
                   ,&local_41c,&local_3cc);
        if (local_268 != (code *)0x0) {
          (*local_268)(&local_278,&local_278,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if (local_3f8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1211,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_3f8 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_41c = 6;
        pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
        local_3c0._M_head_impl = (x509_st *)local_350._0_8_;
        __l_29._M_len = 1;
        __l_29._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_29,&local_431);
        local_3c8._M_head_impl = (x509_st *)local_368._0_8_;
        __l_30._M_len = 1;
        __l_30._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_30,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_298._M_unused._M_object = (void *)0x0;
        local_298._8_8_ = 0;
        local_288 = (code *)0x0;
        uStack_280 = 0;
        local_3cc = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_298);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"6",
                   "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.bad_key.get()}, {})",
                   &local_41c,&local_3cc);
        if (local_288 != (code *)0x0) {
          (*local_288)(&local_298,&local_298,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if (local_3f8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1214,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )local_3f8 !=
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_41c = 6;
        pXVar1 = (X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]);
        local_3c0._M_head_impl = (x509_st *)local_350._0_8_;
        __l_31._M_len = 1;
        __l_31._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_31,&local_431);
        local_3c8._M_head_impl =
             (x509_st *)
             local_370._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        __l_32._M_len = 1;
        __l_32._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_32,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2b8._M_unused._M_object = (void *)0x0;
        local_2b8._8_8_ = 0;
        local_2a8 = (code *)0x0;
        uStack_2a0 = 0;
        local_3cc = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_2b8);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"6",
                   "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.bad_key_type.get()}, {})"
                   ,&local_41c,&local_3cc);
        if (local_2a8 != (code *)0x0) {
          (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1217,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_41c = 0;
        local_3c0._M_head_impl = (x509_st *)local_350._0_8_;
        __l_33._M_len = 1;
        __l_33._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_33,&local_431);
        local_3c8._M_head_impl = (x509_st *)CONCAT71(local_378._1_7_,local_378[0]);
        __l_34._M_len = 1;
        __l_34._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_34,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2d8._M_unused._M_object = (void *)0x0;
        local_2d8._8_8_ = 0;
        local_2c8 = (code *)0x0;
        uStack_2c0 = 0;
        local_3cc = Verify((X509 *)local_390._0_8_,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_2d8);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"0",
                   "Verify(leaf.bad_key.get(), {root.valid.get()}, {intermediate.valid.get()}, {})",
                   &local_41c,&local_3cc);
        if (local_2c8 != (code *)0x0) {
          (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_3f8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x121b,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if (local_3f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        _Var2._M_head_impl = local_398._M_head_impl;
        local_41c = 0;
        local_3c0._M_head_impl = (x509_st *)local_350._0_8_;
        __l_35._M_len = 1;
        __l_35._M_array = &local_3c0._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,__l_35,&local_431);
        local_3c8._M_head_impl = (x509_st *)CONCAT71(local_378._1_7_,local_378[0]);
        __l_36._M_len = 1;
        __l_36._M_array = &local_3c8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,__l_36,&local_432);
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2f8._M_unused._M_object = (void *)0x0;
        local_2f8._8_8_ = 0;
        local_2e8 = (code *)0x0;
        uStack_2e0 = 0;
        local_3cc = Verify(_Var2._M_head_impl,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                           (function<void_(x509_store_ctx_st_*)> *)&local_2f8);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"0",
                   "Verify(leaf.bad_key_type.get(), {root.valid.get()}, {intermediate.valid.get()}, {})"
                   ,&local_41c,&local_3cc);
        if (local_2e8 != (code *)0x0) {
          (*local_2e8)(&local_2f8,&local_2f8,__destroy_functor);
        }
        if (local_418 != (undefined1  [8])0x0) {
          operator_delete((void *)local_418,(long)local_408 - (long)local_418);
        }
        if (local_3f8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity - (long)local_3f8);
        }
        if (local_430.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x121d,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_3f8 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_428,local_428);
        }
        local_3c0._M_head_impl._0_4_ = 0x15;
        local_3e8._M_allocated_capacity = 0;
        local_3f8 = (undefined1  [8])0x0;
        pbStack_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_408 = (pointer)0x0;
        local_418 = (undefined1  [8])0x0;
        pbStack_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_318._M_unused._M_object = (void *)0x0;
        local_318._8_8_ = 0;
        local_300 = std::
                    _Function_handler<void_(x509_store_ctx_st_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc:4643:3)>
                    ::_M_invoke;
        local_308 = std::
                    _Function_handler<void_(x509_store_ctx_st_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc:4643:3)>
                    ::_M_manager;
        iVar3 = Verify((X509 *)CONCAT71(local_3a0._1_7_,local_3a0[0]),
                       (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_3f8,
                       (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_418,&local_3b8,0,
                       (function<void_(x509_store_ctx_st_*)> *)&local_318);
        local_3c8._M_head_impl._0_4_ = iVar3;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_430,"21",
                   "Verify(leaf.valid.get(), {}, {}, {}, 0, [](X509_STORE_CTX *ctx) { X509_STORE_CTX_set_verify_cb( ctx, [](int ok, X509_STORE_CTX *ctx_inner) -> int { if (ok) { return ok; } int err = X509_STORE_CTX_get_error(ctx_inner); return err == 20; }); })"
                   ,(int *)&local_3c0,(int *)&local_3c8);
        if (local_308 != (code *)0x0) {
          (*local_308)(&local_318,&local_318,__destroy_functor);
        }
        if (((byte)local_430.data_._0_1_ & 1) == 0) {
          testing::Message::Message((Message *)local_3f8);
          if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message = "";
          }
          else {
            message = (local_428->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x122e,message);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_3f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )local_3f8 !=
              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(size_type *)local_3f8 + 8))();
          }
        }
        if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_428;
LAB_003c8f21:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(this_00,local_428);
        }
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_380);
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)(local_390 + 8));
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_390);
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_398);
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_3a0);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_358);
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)(local_368 + 8));
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_368);
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_370);
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_378);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_330);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_338);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)(local_350 + 0x10));
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)(local_350 + 8));
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_350);
LAB_003c8fe9:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_320);
  return;
}

Assistant:

TEST(X509Test, SignatureVerification) {
  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  struct Certs {
    bssl::UniquePtr<X509> valid;
    bssl::UniquePtr<X509> bad_key_type, bad_key;
    bssl::UniquePtr<X509> bad_sig_type, bad_sig;
  };
  auto make_certs = [&](const char *issuer, const char *subject,
                        bool is_ca) -> Certs {
    Certs certs;
    certs.valid = MakeTestCert(issuer, subject, key.get(), is_ca);
    if (certs.valid == nullptr ||
        !X509_sign(certs.valid.get(), key.get(), EVP_sha256())) {
      return Certs{};
    }

    static const uint8_t kInvalid[] = {'i', 'n', 'v', 'a', 'l', 'i', 'd'};

    // Extracting the algorithm identifier from |certs.valid|'s SPKI, with
    // OpenSSL's API, is very tedious. Instead, we'll just rely on knowing it is
    // ecPublicKey with P-256 as parameters.
    const ASN1_BIT_STRING *pubkey = X509_get0_pubkey_bitstr(certs.valid.get());
    int pubkey_len = ASN1_STRING_length(pubkey);

    // Sign a copy of the certificate where the key type is an unsupported OID.
    bssl::UniquePtr<uint8_t> pubkey_data(static_cast<uint8_t *>(
        OPENSSL_memdup(ASN1_STRING_get0_data(pubkey), pubkey_len)));
    certs.bad_key_type = MakeTestCert(issuer, subject, key.get(), is_ca);
    if (pubkey_data == nullptr || certs.bad_key_type == nullptr ||
        !X509_PUBKEY_set0_param(X509_get_X509_PUBKEY(certs.bad_key_type.get()),
                                OBJ_nid2obj(NID_subject_alt_name), V_ASN1_UNDEF,
                                /*param_value=*/nullptr, pubkey_data.release(),
                                pubkey_len) ||
        !X509_sign(certs.bad_key_type.get(), key.get(), EVP_sha256())) {
      return Certs{};
    }

    // Sign a copy of the certificate where the key data is unparsable.
    pubkey_data.reset(
        static_cast<uint8_t *>(OPENSSL_memdup(kInvalid, sizeof(kInvalid))));
    certs.bad_key = MakeTestCert(issuer, subject, key.get(), is_ca);
    if (pubkey_data == nullptr || certs.bad_key == nullptr ||
        !X509_PUBKEY_set0_param(X509_get_X509_PUBKEY(certs.bad_key.get()),
                                OBJ_nid2obj(NID_X9_62_id_ecPublicKey),
                                V_ASN1_OBJECT,
                                OBJ_nid2obj(NID_X9_62_prime256v1),
                                pubkey_data.release(), sizeof(kInvalid)) ||
        !X509_sign(certs.bad_key.get(), key.get(), EVP_sha256())) {
      return Certs{};
    }

    bssl::UniquePtr<X509_ALGOR> wrong_algo(X509_ALGOR_new());
    if (wrong_algo == nullptr ||
        !X509_ALGOR_set0(wrong_algo.get(), OBJ_nid2obj(NID_subject_alt_name),
                         V_ASN1_NULL, nullptr)) {
      return Certs{};
    }

    certs.bad_sig_type.reset(X509_dup(certs.valid.get()));
    if (certs.bad_sig_type == nullptr ||
        !X509_set1_signature_algo(certs.bad_sig_type.get(), wrong_algo.get())) {
      return Certs{};
    }

    certs.bad_sig.reset(X509_dup(certs.valid.get()));
    if (certs.bad_sig == nullptr ||
        !X509_set1_signature_value(certs.bad_sig.get(), kInvalid,
                                   sizeof(kInvalid))) {
      return Certs{};
    }

    return certs;
  };

  Certs root(make_certs("Root", "Root", /*is_ca=*/true));
  ASSERT_TRUE(root.valid);
  Certs intermediate(make_certs("Root", "Intermediate", /*is_ca=*/true));
  ASSERT_TRUE(intermediate.valid);
  Certs leaf(make_certs("Intermediate", "Leaf", /*is_ca=*/false));
  ASSERT_TRUE(leaf.valid);

  // Check the base chain.
  EXPECT_EQ(X509_V_OK, Verify(leaf.valid.get(), {root.valid.get()},
                              {intermediate.valid.get()}, {}));

  // An invalid or unsupported signature in the leaf or intermediate is noticed.
  EXPECT_EQ(X509_V_ERR_CERT_SIGNATURE_FAILURE,
            Verify(leaf.bad_sig.get(), {root.valid.get()},
                   {intermediate.valid.get()}, {}));
  EXPECT_EQ(X509_V_ERR_CERT_SIGNATURE_FAILURE,
            Verify(leaf.bad_sig_type.get(), {root.valid.get()},
                   {intermediate.valid.get()}, {}));
  EXPECT_EQ(X509_V_ERR_CERT_SIGNATURE_FAILURE,
            Verify(leaf.valid.get(), {root.valid.get()},
                   {intermediate.bad_sig.get()}, {}));
  EXPECT_EQ(X509_V_ERR_CERT_SIGNATURE_FAILURE,
            Verify(leaf.valid.get(), {root.valid.get()},
                   {intermediate.bad_sig_type.get()}, {}));

  // By default, the redundant root signature is not checked.
  EXPECT_EQ(X509_V_OK, Verify(leaf.valid.get(), {root.bad_sig.get()},
                              {intermediate.valid.get()}, {}));
  EXPECT_EQ(X509_V_OK, Verify(leaf.valid.get(), {root.bad_sig_type.get()},
                              {intermediate.valid.get()}, {}));

  // The caller can request checking it, although it's pointless.
  EXPECT_EQ(
      X509_V_ERR_CERT_SIGNATURE_FAILURE,
      Verify(leaf.valid.get(), {root.bad_sig.get()}, {intermediate.valid.get()},
             {}, X509_V_FLAG_CHECK_SS_SIGNATURE));
  EXPECT_EQ(
      X509_V_ERR_CERT_SIGNATURE_FAILURE,
      Verify(leaf.valid.get(), {root.bad_sig_type.get()},
             {intermediate.valid.get()}, {}, X509_V_FLAG_CHECK_SS_SIGNATURE));

  // The above also applies when accepting a trusted, self-signed root as the
  // target certificate.
  EXPECT_EQ(X509_V_OK,
            Verify(root.bad_sig.get(), {root.bad_sig.get()}, {}, {}));
  EXPECT_EQ(X509_V_OK,
            Verify(root.bad_sig_type.get(), {root.bad_sig_type.get()}, {}, {}));
  EXPECT_EQ(X509_V_ERR_CERT_SIGNATURE_FAILURE,
            Verify(root.bad_sig.get(), {root.bad_sig.get()}, {}, {},
                   X509_V_FLAG_CHECK_SS_SIGNATURE));
  EXPECT_EQ(X509_V_ERR_CERT_SIGNATURE_FAILURE,
            Verify(root.bad_sig_type.get(), {root.bad_sig_type.get()}, {}, {},
                   X509_V_FLAG_CHECK_SS_SIGNATURE));

  // If an intermediate is a trust anchor, the redundant signature is always
  // ignored, even with |X509_V_FLAG_CHECK_SS_SIGNATURE|. (We cannot check the
  // signature without the key.)
  EXPECT_EQ(X509_V_OK,
            Verify(leaf.valid.get(), {intermediate.bad_sig.get()}, {}, {},
                   X509_V_FLAG_CHECK_SS_SIGNATURE | X509_V_FLAG_PARTIAL_CHAIN));
  EXPECT_EQ(X509_V_OK,
            Verify(leaf.valid.get(), {intermediate.bad_sig_type.get()}, {}, {},
                   X509_V_FLAG_CHECK_SS_SIGNATURE | X509_V_FLAG_PARTIAL_CHAIN));
  EXPECT_EQ(X509_V_OK, Verify(leaf.valid.get(), {intermediate.bad_sig.get()},
                              {}, {}, X509_V_FLAG_PARTIAL_CHAIN));
  EXPECT_EQ(X509_V_OK,
            Verify(leaf.valid.get(), {intermediate.bad_sig_type.get()}, {}, {},
                   X509_V_FLAG_PARTIAL_CHAIN));

  // Bad keys in the root and intermediate are rejected.
  EXPECT_EQ(X509_V_ERR_UNABLE_TO_DECODE_ISSUER_PUBLIC_KEY,
            Verify(leaf.valid.get(), {root.bad_key.get()},
                   {intermediate.valid.get()}, {}));
  EXPECT_EQ(X509_V_ERR_UNABLE_TO_DECODE_ISSUER_PUBLIC_KEY,
            Verify(leaf.valid.get(), {root.bad_key_type.get()},
                   {intermediate.valid.get()}, {}));
  EXPECT_EQ(X509_V_ERR_UNABLE_TO_DECODE_ISSUER_PUBLIC_KEY,
            Verify(leaf.valid.get(), {root.valid.get()},
                   {intermediate.bad_key.get()}, {}));
  EXPECT_EQ(X509_V_ERR_UNABLE_TO_DECODE_ISSUER_PUBLIC_KEY,
            Verify(leaf.valid.get(), {root.valid.get()},
                   {intermediate.bad_key_type.get()}, {}));

  // Bad keys in the leaf are ignored. The leaf's key is used by the caller.
  EXPECT_EQ(X509_V_OK, Verify(leaf.bad_key.get(), {root.valid.get()},
                              {intermediate.valid.get()}, {}));
  EXPECT_EQ(X509_V_OK, Verify(leaf.bad_key_type.get(), {root.valid.get()},
                              {intermediate.valid.get()}, {}));

  // At the time we go to verify signatures, it is possible that we have a
  // single-element certificate chain with a certificate that isn't self-signed.
  // This does not seem to be reachable except if missing trust anchors are
  // suppressed with the verify callback, but exercise this codepath anyway.
  EXPECT_EQ(X509_V_ERR_UNABLE_TO_VERIFY_LEAF_SIGNATURE,
            Verify(leaf.valid.get(), {}, {}, {}, 0, [](X509_STORE_CTX *ctx) {
              X509_STORE_CTX_set_verify_cb(
                  ctx, [](int ok, X509_STORE_CTX *ctx_inner) -> int {
                    if (ok) {
                      return ok;
                    }
                    // Suppress the missing issuer certificate.
                    int err = X509_STORE_CTX_get_error(ctx_inner);
                    return err == X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT_LOCALLY;
                  });
            }));
}